

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler_log_formatter.hpp
# Opt level: O0

void __thiscall
boost::unit_test::output::compiler_log_formatter::~compiler_log_formatter
          (compiler_log_formatter *this)

{
  void *in_RDI;
  
  ~compiler_log_formatter((compiler_log_formatter *)0x247ef8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class BOOST_TEST_DECL compiler_log_formatter : public unit_test_log_formatter {
public:
    compiler_log_formatter() : m_color_output( false ) {}

    // Formatter interface
    void    log_start( std::ostream&, counter_t test_cases_amount );
    void    log_finish( std::ostream& );
    void    log_build_info( std::ostream& );

    void    test_unit_start( std::ostream&, test_unit const& tu );
    void    test_unit_finish( std::ostream&, test_unit const& tu, unsigned long elapsed );
    void    test_unit_skipped( std::ostream&, test_unit const& tu, const_string reason );

    void    log_exception_start( std::ostream&, log_checkpoint_data const&, execution_exception const& ex );
    void    log_exception_finish( std::ostream& );

    void    log_entry_start( std::ostream&, log_entry_data const&, log_entry_types let );
    void    log_entry_value( std::ostream&, const_string value );
    void    log_entry_value( std::ostream&, lazy_ostream const& value );
    void    log_entry_finish( std::ostream& );

    void    entry_context_start( std::ostream&, log_level );
    void    log_entry_context( std::ostream&, log_level l, const_string );
    void    entry_context_finish( std::ostream&, log_level l );

protected:
    virtual void    print_prefix( std::ostream&, const_string file, std::size_t line );

    // Data members
    bool    m_color_output;
}